

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LoadImm12(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t extraout_RDX;
  uint64_t Address_02;
  uint uVar4;
  uint RegNo;
  
  uVar4 = Insn >> 0x10 & 0xf;
  if (uVar4 == 0xf) {
    uVar4 = MCInst_getOpcode(Inst);
    if (uVar4 == 0x945) {
      uVar4 = 0x947;
    }
    else if (uVar4 == 0x9b1) {
      uVar4 = 0x9b3;
    }
    else if (uVar4 == 0x95c) {
      uVar4 = 0x95e;
    }
    else if (uVar4 == 0x964) {
      uVar4 = 0x966;
    }
    else if (uVar4 == 0x96c) {
      uVar4 = 0x96e;
    }
    else if (uVar4 == 0x9ad) {
      uVar4 = 0x9af;
    }
    else {
      if (uVar4 != 0x954) {
        return MCDisassembler_Fail;
      }
      uVar4 = 0x956;
    }
    MCInst_setOpcode(Inst,uVar4);
    DVar3 = DecodeT2LoadLabel(Inst,Insn,Address_02,Decoder);
    return DVar3;
  }
  RegNo = Insn >> 0xc & 0xf;
  if (RegNo == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x964) {
      return MCDisassembler_Fail;
    }
    if (uVar1 == 0x954) {
      MCInst_setOpcode(Inst,0x9ad);
    }
  }
  uVar1 = MCInst_getOpcode(Inst);
  if ((uVar1 - 0x9aa < 8) && (Decoder = (void *)0x89, (0x89U >> (uVar1 - 0x9aa & 0x1f) & 1) != 0)) {
    DVar3 = MCDisassembler_Success;
    Address_01 = Address_00;
  }
  else {
    DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
    Address_01 = extraout_RDX;
    if ((DVar3 | 2) != MCDisassembler_Success) {
      return MCDisassembler_Fail;
    }
  }
  DVar2 = DecodeT2AddrModeImm12(Inst,uVar4 << 0xd | Insn & 0xfff,Address_01,Decoder);
  if (DVar2 == MCDisassembler_Fail) {
    return MCDisassembler_Fail;
  }
  if (DVar2 == MCDisassembler_Success) {
    return DVar3;
  }
  if (DVar2 != MCDisassembler_SoftFail) {
    return MCDisassembler_Fail;
  }
  return MCDisassembler_SoftFail;
}

Assistant:

static DecodeStatus DecodeT2LoadImm12(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= (Rn << 13);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi12:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi12:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2PLDi12:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi12:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi12:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi12:
				MCInst_setOpcode(Inst, ARM_t2PLDi12);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi12:
		case ARM_t2PLDWi12:
		case ARM_t2PLIi12:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm12(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}